

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

void __thiscall despot::Parser::ParseTerminalStateTag(Parser *this,TiXmlHandle *handle)

{
  pointer pcVar1;
  int *__n;
  pointer pSVar2;
  long lVar3;
  undefined8 __s2;
  undefined8 uVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  TiXmlNode *this_00;
  TiXmlElement *this_01;
  TiXmlElement *pTVar7;
  char *pcVar8;
  size_type *psVar9;
  long lVar10;
  ulong uVar11;
  string name;
  TerminalPattern pattern;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  instance;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  undefined1 local_138 [47];
  allocator<char> local_109;
  string local_108;
  TiXmlElement *local_e8;
  Parser *local_e0;
  undefined1 local_d8 [24];
  _Rb_tree<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_std::_Identity<std::vector<int,_std::allocator<int>_>_>,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_90;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  string local_60;
  vector<despot::TerminalPattern,_std::allocator<despot::TerminalPattern>_> *local_40;
  TiXmlElement *local_38;
  undefined4 extraout_var_00;
  
  util::tinyxml::TiXmlHandle::FirstChild((TiXmlHandle *)local_138,(char *)handle);
  util::tinyxml::TiXmlHandle::FirstChild((TiXmlHandle *)local_d8,local_138);
  if (((TiXmlNode *)local_d8._0_8_ == (TiXmlNode *)0x0) ||
     (iVar5 = (*((TiXmlBase *)local_d8._0_8_)->_vptr_TiXmlBase[0xb])(),
     CONCAT44(extraout_var,iVar5) == 0)) {
    this_00 = (TiXmlNode *)0x0;
  }
  else {
    iVar5 = (*((TiXmlBase *)local_d8._0_8_)->_vptr_TiXmlBase[0xb])();
    this_00 = (TiXmlNode *)CONCAT44(extraout_var_00,iVar5);
  }
  if ((this_00 != (TiXmlNode *)0x0) &&
     (this_01 = util::tinyxml::TiXmlNode::FirstChildElement(this_00,"Table"),
     this_01 != (TiXmlElement *)0x0)) {
    local_40 = &this->terminal_state_patterns_;
    local_e0 = this;
    do {
      local_d8._0_8_ = (TiXmlNode *)0x0;
      local_d8._8_8_ = (int *)0x0;
      local_d8._16_8_ = (int *)0x0;
      local_c0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_c0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_c0._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_c0._M_impl.super__Rb_tree_header._M_header;
      local_c0._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_c0._M_impl.super__Rb_tree_header._M_header._M_right =
           local_c0._M_impl.super__Rb_tree_header._M_header._M_left;
      pTVar7 = util::tinyxml::TiXmlNode::FirstChildElement(&this_01->super_TiXmlNode,"Vars");
      pcVar8 = util::tinyxml::TiXmlElement::GetText(pTVar7);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_138,pcVar8,(allocator<char> *)&local_108);
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_108," ","");
      Tokenize(&local_78,(string *)local_138,&local_108);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
      }
      if ((TiXmlNode *)local_138._0_8_ != (TiXmlNode *)(local_138 + 0x10)) {
        operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
      }
      local_e8 = this_01;
      if (local_78.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_78.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        uVar11 = 0;
        do {
          local_138._0_8_ = local_138 + 0x10;
          pcVar1 = local_78.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar11]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_138,pcVar1,
                     pcVar1 + local_78.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar11]._M_string_length);
          uVar4 = local_138._8_8_;
          __s2 = local_138._0_8_;
          psVar9 = &(((this->curr_state_vars_).
                      super__Vector_base<despot::StateVar,_std::allocator<despot::StateVar>_>.
                      _M_impl.super__Vector_impl_data._M_start)->super_NamedVar).name_.
                    _M_string_length;
          iVar5 = 0;
          while( true ) {
            local_108._M_dataplus._M_p._0_4_ = iVar5;
            __n = (int *)*psVar9;
            if ((__n == (int *)uVar4) &&
               ((__n == (int *)0x0 ||
                (iVar6 = bcmp((((string *)(psVar9 + -1))->_M_dataplus)._M_p,(void *)__s2,(size_t)__n
                             ), iVar6 == 0)))) break;
            iVar5 = iVar5 + 1;
            psVar9 = psVar9 + 0x18;
          }
          if (local_d8._8_8_ == local_d8._16_8_) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)local_d8,(iterator)local_d8._8_8_,
                       (int *)&local_108);
          }
          else {
            *(int *)local_d8._8_8_ = iVar5;
            local_d8._8_8_ = local_d8._8_8_ + 4;
          }
          this = local_e0;
          this_01 = local_e8;
          if ((TiXmlNode *)local_138._0_8_ != (TiXmlNode *)(local_138 + 0x10)) {
            operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
          }
          uVar11 = uVar11 + 1;
        } while (uVar11 < (ulong)((long)local_78.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_78.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 5));
      }
      pTVar7 = util::tinyxml::TiXmlNode::FirstChildElement(&this_01->super_TiXmlNode,"Instance");
      while (pTVar7 != (TiXmlElement *)0x0) {
        pcVar8 = util::tinyxml::TiXmlElement::GetText(pTVar7);
        std::__cxx11::string::string<std::allocator<char>>((string *)local_138,pcVar8,&local_109);
        local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_108," ","");
        Tokenize(&local_90,(string *)local_138,&local_108);
        local_38 = pTVar7;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_dataplus._M_p != &local_108.field_2) {
          operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
        }
        if ((TiXmlNode *)local_138._0_8_ != (TiXmlNode *)(local_138 + 0x10)) {
          operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
        }
        local_138._0_8_ = (TiXmlNode *)0x0;
        local_138._8_8_ = (int *)0x0;
        local_138._16_8_ = (int *)0x0;
        if (local_90.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            local_90.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          lVar10 = 8;
          uVar11 = 0;
          do {
            iVar5 = *(int *)((long)&((TiXmlBase *)local_d8._0_8_)->_vptr_TiXmlBase + uVar11 * 4);
            pSVar2 = (this->curr_state_vars_).
                     super__Vector_base<despot::StateVar,_std::allocator<despot::StateVar>_>._M_impl
                     .super__Vector_impl_data._M_start;
            local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
            lVar3 = *(long *)((long)local_90.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + lVar10 + -8);
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_60,lVar3,
                       *(long *)((long)&((local_90.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                        _M_p + lVar10) + lVar3);
            iVar5 = Variable::IndexOf((Variable *)(pSVar2 + iVar5),&local_60);
            local_108._M_dataplus._M_p._0_4_ = iVar5;
            if (local_138._8_8_ == local_138._16_8_) {
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        ((vector<int,_std::allocator<int>_> *)local_138,(iterator)local_138._8_8_,
                         (int *)&local_108);
            }
            else {
              *(int *)local_138._8_8_ = iVar5;
              local_138._8_8_ = local_138._8_8_ + 4;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_60._M_dataplus._M_p != &local_60.field_2) {
              operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
            }
            uVar11 = uVar11 + 1;
            lVar10 = lVar10 + 0x20;
          } while (uVar11 < (ulong)((long)local_90.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_90.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 5));
        }
        std::
        _Rb_tree<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>,std::_Identity<std::vector<int,std::allocator<int>>>,std::less<std::vector<int,std::allocator<int>>>,std::allocator<std::vector<int,std::allocator<int>>>>
        ::_M_insert_unique<std::vector<int,std::allocator<int>>const&>
                  ((_Rb_tree<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>,std::_Identity<std::vector<int,std::allocator<int>>>,std::less<std::vector<int,std::allocator<int>>>,std::allocator<std::vector<int,std::allocator<int>>>>
                    *)&local_c0,(vector<int,_std::allocator<int>_> *)local_138);
        pTVar7 = util::tinyxml::TiXmlNode::NextSiblingElement(&local_38->super_TiXmlNode);
        if ((TiXmlNode *)local_138._0_8_ != (TiXmlNode *)0x0) {
          operator_delete((void *)local_138._0_8_,local_138._16_8_ - local_138._0_8_);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_90);
        this_01 = local_e8;
      }
      std::vector<despot::TerminalPattern,_std::allocator<despot::TerminalPattern>_>::push_back
                (local_40,(value_type *)local_d8);
      this_01 = util::tinyxml::TiXmlNode::NextSiblingElement(&this_01->super_TiXmlNode);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_78);
      std::
      _Rb_tree<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_std::_Identity<std::vector<int,_std::allocator<int>_>_>,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~_Rb_tree(&local_c0);
      if ((TiXmlNode *)local_d8._0_8_ != (TiXmlNode *)0x0) {
        operator_delete((void *)local_d8._0_8_,local_d8._16_8_ - local_d8._0_8_);
      }
    } while (this_01 != (TiXmlElement *)0x0);
  }
  return;
}

Assistant:

void Parser::ParseTerminalStateTag(TiXmlHandle& handle) {
	TiXmlElement* e_Terminal = handle.FirstChild("pomdpx").FirstChild(
		"TerminalState").ToElement();

	if (e_Terminal == NULL)
		return;

	// <Table>
	TiXmlElement* e_Table = GetFirstChildElement(e_Terminal, "Table");
	while (e_Table != NULL) {
		TerminalPattern pattern;
		// <Vars>
		vector<string> names = Tokenize(GetFirstChildText(e_Table, "Vars"));
		for (int i = 0; i < names.size(); i++) {
			string name = names[i];
			int id = 0;
			while (curr_state_vars_[id].name() != name)
				id++;
			pattern.state_ids.push_back(id);
		}

		TiXmlElement* e_Instance = e_Table->FirstChildElement("Instance");
		while (e_Instance != NULL) {
			// <Instance>
			vector<string> instance = Tokenize(e_Instance->GetText());
			vector<int> values;
			for (int i = 0; i < instance.size(); i++) {
				values.push_back(
					curr_state_vars_[pattern.state_ids[i]].IndexOf(
						instance[i]));
			}
			pattern.state_vals.insert(values);

			e_Instance = e_Instance->NextSiblingElement();
		}

		terminal_state_patterns_.push_back(pattern);

		e_Table = e_Table->NextSiblingElement();
	}
}